

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaValidateLengthFacetInternal
              (xmlSchemaFacetPtr facet,xmlSchemaValType valType,xmlChar *value,xmlSchemaValPtr val,
              unsigned_long *length,xmlSchemaWhitespaceValueType ws)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaValPtr pxVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  
  if (facet == (xmlSchemaFacetPtr)0x0 || length == (unsigned_long *)0x0) {
    return -1;
  }
  *length = 0;
  if (2 < facet->type - XML_SCHEMA_FACET_LENGTH) {
    return -1;
  }
  pxVar2 = facet->val;
  if (pxVar2 == (xmlSchemaValPtr)0x0) {
    return -1;
  }
  if ((pxVar2->type != XML_SCHEMAS_NNINTEGER) && (pxVar2->type != XML_SCHEMAS_DECIMAL)) {
    return -1;
  }
  iVar3 = xmlSchemaValDecimalIsInteger(&(pxVar2->value).decimal);
  if (iVar3 == 0) {
    return -1;
  }
  if ((val != (xmlSchemaValPtr)0x0) &&
     ((val->type == XML_SCHEMAS_BASE64BINARY || (val->type == XML_SCHEMAS_HEXBINARY)))) {
    uVar4 = (val->value).decimal.integralPlaces;
    goto LAB_001a3afa;
  }
  uVar4 = 0;
  if (XML_SCHEMAS_ANYURI < valType) goto LAB_001a3afa;
  if ((0x21d70000U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) == 0) {
    if ((6U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) == 0) {
      if ((0x10200000U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) != 0) {
        return 0;
      }
      goto LAB_001a3afa;
    }
    if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
      if (valType == XML_SCHEMAS_STRING) {
LAB_001a3b86:
        uVar4 = xmlUTF8Strlen(value);
        goto LAB_001a3afa;
      }
    }
    else {
      if (value == (xmlChar *)0x0) goto LAB_001a3afa;
      if (ws != XML_SCHEMA_WHITESPACE_COLLAPSE) goto LAB_001a3b86;
    }
  }
  else if (value == (xmlChar *)0x0) goto LAB_001a3afa;
  uVar4 = xmlSchemaNormLen(value);
LAB_001a3afa:
  uVar6 = (ulong)uVar4;
  *length = uVar6;
  xVar1 = facet->type;
  uVar5 = xmlSchemaGetFacetValueAsULong(facet);
  if (xVar1 == XML_SCHEMA_FACET_MINLENGTH) {
    if (uVar6 < uVar5) {
      return 0x727;
    }
  }
  else if (xVar1 == XML_SCHEMA_FACET_LENGTH) {
    if (uVar5 != uVar6) {
      return 0x726;
    }
  }
  else if (uVar5 < uVar6) {
    return 0x728;
  }
  return 0;
}

Assistant:

static int
xmlSchemaValidateLengthFacetInternal(xmlSchemaFacetPtr facet,
				     xmlSchemaValType valType,
				     const xmlChar *value,
				     xmlSchemaValPtr val,
				     unsigned long *length,
				     xmlSchemaWhitespaceValueType ws)
{
    unsigned int len = 0;

    if ((length == NULL) || (facet == NULL))
        return (-1);
    *length = 0;
    if ((facet->type != XML_SCHEMA_FACET_LENGTH) &&
	(facet->type != XML_SCHEMA_FACET_MAXLENGTH) &&
	(facet->type != XML_SCHEMA_FACET_MINLENGTH))
	return (-1);

    /*
    * TODO: length, maxLength and minLength must be of type
    * nonNegativeInteger only. Check if decimal is used somehow.
    */
    if ((facet->val == NULL) ||
	((facet->val->type != XML_SCHEMAS_DECIMAL) &&
	 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
	!(xmlSchemaValDecimalIsInteger(&facet->val->value.decimal)))
 {
	return(-1);
    }
    if ((val != NULL) && (val->type == XML_SCHEMAS_HEXBINARY))
	len = val->value.hex.total;
    else if ((val != NULL) && (val->type == XML_SCHEMAS_BASE64BINARY))
	len = val->value.base64.total;
    else {
	switch (valType) {
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
		if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
		    /*
		    * This is to ensure API compatibility with the old
		    * xmlSchemaValidateLengthFacet(). Anyway, this was and
		    * is not the correct handling.
		    * TODO: Get rid of this case somehow.
		    */
		    if (valType == XML_SCHEMAS_STRING)
			len = xmlUTF8Strlen(value);
		    else
			len = xmlSchemaNormLen(value);
		} else if (value != NULL) {
		    if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			len = xmlSchemaNormLen(value);
		    else
		    /*
		    * Should be OK for "preserve" as well.
		    */
		    len = xmlUTF8Strlen(value);
		}
		break;
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
		/*
		* FIXME: What exactly to do with anyURI?
		*/
	    case XML_SCHEMAS_ANYURI:
		if (value != NULL)
		    len = xmlSchemaNormLen(value);
		break;
	    case XML_SCHEMAS_QNAME:
	    case XML_SCHEMAS_NOTATION:
		/*
		* For QName and NOTATION, those facets are
		* deprecated and should be ignored.
		*/
		return (0);
	    default:
		/* TODO */
                break;
	}
    }
    *length = (unsigned long) len;
    /*
    * TODO: Return the whole expected value. (This may be possible now with xmlSchemaValDecimalCompareWithInteger)
    */
    if (facet->type == XML_SCHEMA_FACET_LENGTH) {
        if (len != xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_LENGTH_VALID);
    } else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
        if (len < xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_MINLENGTH_VALID);
    } else {
        if (len > xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_MAXLENGTH_VALID);
    }

    return (0);
}